

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined2 uVar1;
  int32_t *piVar2;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [2];
  int32_t *cospi;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  
  piVar2 = cospi_arr(0xc);
  uVar1 = (undefined2)(piVar2[0x20] << 3);
  auVar3._2_2_ = uVar1;
  auVar3._0_2_ = uVar1;
  auVar3._4_2_ = uVar1;
  auVar3._6_2_ = uVar1;
  auVar3._10_2_ = uVar1;
  auVar3._8_2_ = uVar1;
  auVar3._12_2_ = uVar1;
  auVar3._14_2_ = uVar1;
  uVar1 = (undefined2)(piVar2[0x20] << 3);
  auVar4._2_2_ = uVar1;
  auVar4._0_2_ = uVar1;
  auVar4._4_2_ = uVar1;
  auVar4._6_2_ = uVar1;
  auVar4._10_2_ = uVar1;
  auVar4._8_2_ = uVar1;
  auVar4._12_2_ = uVar1;
  auVar4._14_2_ = uVar1;
  auVar3 = pmulhrsw(*in_RDI,auVar3);
  auVar4 = pmulhrsw(*in_RDI,auVar4);
  local_c8 = auVar3._0_8_;
  uStack_c0 = auVar3._8_8_;
  *in_RSI = local_c8;
  in_RSI[1] = uStack_c0;
  in_RSI[0x1e] = local_c8;
  in_RSI[0x1f] = uStack_c0;
  local_b8 = auVar4._0_8_;
  uStack_b0 = auVar4._8_8_;
  in_RSI[2] = local_b8;
  in_RSI[3] = uStack_b0;
  in_RSI[0x1c] = local_b8;
  in_RSI[0x1d] = uStack_b0;
  in_RSI[4] = local_b8;
  in_RSI[5] = uStack_b0;
  in_RSI[0x1a] = local_b8;
  in_RSI[0x1b] = uStack_b0;
  in_RSI[6] = local_c8;
  in_RSI[7] = uStack_c0;
  in_RSI[0x18] = local_c8;
  in_RSI[0x19] = uStack_c0;
  in_RSI[8] = local_c8;
  in_RSI[9] = uStack_c0;
  in_RSI[0x16] = local_c8;
  in_RSI[0x17] = uStack_c0;
  in_RSI[10] = local_b8;
  in_RSI[0xb] = uStack_b0;
  in_RSI[0x14] = local_b8;
  in_RSI[0x15] = uStack_b0;
  in_RSI[0xc] = local_b8;
  in_RSI[0xd] = uStack_b0;
  in_RSI[0x12] = local_b8;
  in_RSI[0x13] = uStack_b0;
  in_RSI[0xe] = local_c8;
  in_RSI[0xf] = uStack_c0;
  in_RSI[0x10] = local_c8;
  in_RSI[0x11] = uStack_c0;
  return;
}

Assistant:

static void idct16_low1_ssse3(const __m128i *input, __m128i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m128i x[2];
  x[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 5
  // stage 6
  // stage 7
  output[0] = x[0];
  output[15] = x[0];
  output[1] = x[1];
  output[14] = x[1];
  output[2] = x[1];
  output[13] = x[1];
  output[3] = x[0];
  output[12] = x[0];
  output[4] = x[0];
  output[11] = x[0];
  output[5] = x[1];
  output[10] = x[1];
  output[6] = x[1];
  output[9] = x[1];
  output[7] = x[0];
  output[8] = x[0];
}